

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O2

void __thiscall DIS::AggregateType::marshal(AggregateType *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_aggregateKind);
  DataStream::operator<<(dataStream,this->_domain);
  DataStream::operator<<(dataStream,this->_country);
  DataStream::operator<<(dataStream,this->_category);
  DataStream::operator<<(dataStream,this->_subcategory);
  DataStream::operator<<(dataStream,this->_specific);
  DataStream::operator<<(dataStream,this->_extra);
  return;
}

Assistant:

void AggregateType::marshal(DataStream& dataStream) const
{
    dataStream << _aggregateKind;
    dataStream << _domain;
    dataStream << _country;
    dataStream << _category;
    dataStream << _subcategory;
    dataStream << _specific;
    dataStream << _extra;
}